

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall
embree::CommandLineParser::parseCommandLine(CommandLineParser *this,int argc,char **argv)

{
  ParseStream *this_00;
  CommandLineStream *this_01;
  Ref<embree::Stream<int>_> local_a8;
  string local_a0;
  CommandLineParser *local_80;
  Ref<embree::ParseStream> local_78;
  string local_70;
  string local_50;
  
  local_80 = this;
  this_00 = (ParseStream *)operator_new(0x48);
  this_01 = (CommandLineStream *)operator_new(0x80);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"command line","");
  CommandLineStream::CommandLineStream(this_01,argc,argv,&local_a0);
  local_a8.ptr = (Stream<int> *)this_01;
  (*(this_01->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this_01);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\n\t\r ","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  ParseStream::ParseStream(this_00,&local_a8,&local_50,&local_70,false);
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[2])(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((CommandLineStream *)local_a8.ptr != (CommandLineStream *)0x0) {
    (*(((Stream<int> *)&(local_a8.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_78.ptr = this_00;
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[2])(this_00);
  FileName::FileName((FileName *)&local_a0);
  parseCommandLine(local_80,&local_78,(FileName *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

void CommandLineParser::parseCommandLine(int argc, char** argv)
  {
    /* create stream for parsing */
    Ref<ParseStream> stream = new ParseStream(new CommandLineStream(argc, argv));
    
    /* parse command line */  
    parseCommandLine(stream, FileName());
  }